

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImGui::RenderArrowDockMenu(ImDrawList *draw_list,ImVec2 p_min,float sz,ImU32 col)

{
  float fVar1;
  float fVar2;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar3;
  ImVec2 local_58;
  ImVec2 local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined1 local_28 [16];
  ImVec2 local_18;
  
  fVar1 = p_min.x;
  fVar2 = p_min.y;
  local_50.x = sz * 0.1 + fVar1;
  local_50.y = sz * 0.15 + fVar2;
  local_18.x = sz * 0.3;
  local_58.x = sz * 0.7 + fVar1;
  local_58.y = local_18.x + fVar2;
  fVar3 = sz;
  if (0xffffff < col) {
    local_28._8_4_ = in_XMM0_Dc;
    local_28._0_8_ = p_min;
    local_28._12_4_ = in_XMM0_Dd;
    local_48 = sz * 0.7;
    fStack_44 = local_18.x;
    fStack_40 = sz * 0.0;
    fStack_3c = sz * 0.0;
    local_38 = sz;
    fStack_34 = sz;
    fStack_30 = sz;
    fStack_2c = sz;
    ImDrawList::PrimReserve(draw_list,6,4);
    ImDrawList::PrimRect(draw_list,&local_50,&local_58,col);
    fVar1 = (float)local_28._0_4_;
    fVar2 = (float)local_28._4_4_;
    sz = local_38;
    fVar3 = fStack_34;
    local_18.x = fStack_44;
  }
  fVar1 = fVar1 + sz * 0.4;
  fVar2 = fVar2 + fVar3 * 0.85;
  local_50.y = fVar2;
  local_50.x = fVar1;
  local_58.x = fVar1 - local_18.x;
  local_58.y = fVar2 - sz * 0.4;
  local_18.x = local_18.x + fVar1;
  local_18.y = local_58.y;
  ImDrawList::AddTriangleFilled(draw_list,&local_58,&local_18,&local_50,col);
  return;
}

Assistant:

void ImGui::RenderArrowDockMenu(ImDrawList* draw_list, ImVec2 p_min, float sz, ImU32 col)
{
    draw_list->AddRectFilled(p_min + ImVec2(sz * 0.10f, sz * 0.15f), p_min + ImVec2(sz * 0.70f, sz * 0.30f), col);
    RenderArrowPointingAt(draw_list, p_min + ImVec2(sz * 0.40f, sz * 0.85f), ImVec2(sz * 0.30f, sz * 0.40f), ImGuiDir_Down, col);
}